

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O0

void __thiscall Shell::NewCNF::NewCNF(NewCNF *this,uint namingThreshold)

{
  uint in_ESI;
  uint *in_RDI;
  double dVar1;
  size_t in_stack_ffffffffffffff78;
  Deque<Kernel::Formula_*> *in_stack_ffffffffffffff80;
  
  *in_RDI = in_ESI;
  dVar1 = log2((double)in_ESI);
  dVar1 = ceil(dVar1);
  in_RDI[1] = (uint)(long)dVar1;
  Lib::Deque<Kernel::Formula_*>::Deque(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  BindingStore::BindingStore((BindingStore *)0x7de2a5);
  BindingStore::BindingStore((BindingStore *)0x7de2ba);
  Lib::DHMap<Kernel::Literal_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<Kernel::Literal_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)(in_RDI + 0x1e))
  ;
  Lib::DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)(in_RDI + 0x28))
  ;
  std::__cxx11::
  list<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ::list((list<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
          *)0x7de2ff);
  Lib::DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>::
  DHMap((DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2> *
        )(in_RDI + 0x38));
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (in_RDI + 0x42));
  *(undefined1 *)(in_RDI + 0x4c) = 0;
  in_RDI[0x4d] = 0;
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  Lib::
  DHMap<Kernel::Formula_*,_const_Lib::SharedSet<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<Kernel::Formula_*,_const_Lib::SharedSet<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x50));
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x5a));
  Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 100));
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x6e));
  Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x78));
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Kernel::Substitution_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Kernel::Substitution_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *)(in_RDI + 0x82));
  return;
}

Assistant:

NewCNF(unsigned namingThreshold)
    : _namingThreshold(namingThreshold), _iteInliningThreshold((unsigned)ceil(log2(namingThreshold))),
      _collectedVarSorts(false), _maxVar(0),_forInduction(false) {}